

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

Type __thiscall miniscript::Node<unsigned_int>::CalcType(Node<unsigned_int> *this)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  size_type sVar4;
  vector<miniscript::Type,_std::allocator<miniscript::Type>_> *this_00;
  int *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_miniscript::Node<unsigned_int>_> *sub;
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  *__range3;
  Type z;
  Type y;
  Type x;
  iterator __end0;
  iterator __begin0;
  vector<miniscript::Type,_std::allocator<miniscript::Type>_> sub_types;
  uint32_t in_stack_00000344;
  vector<miniscript::Type,_std::allocator<miniscript::Type>_> *in_stack_00000348;
  Fragment in_stack_00000354;
  Type in_stack_00000774;
  Type in_stack_00000778;
  Type in_stack_0000077c;
  size_t in_stack_00000790;
  size_t in_stack_00000798;
  size_t in_stack_000007a0;
  MiniscriptContext in_stack_000007a8;
  __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff18;
  Node<unsigned_int> *in_stack_ffffffffffffff20;
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::vector
            ((vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
             in_stack_ffffffffffffff18);
  if (*in_RDI == 0x18) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::begin((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             *)in_stack_ffffffffffffff20);
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::end((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
           *)in_stack_ffffffffffffff20);
    while (bVar2 = __gnu_cxx::
                   operator==<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>_>
                             ((__normal_iterator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>_>
                               *)in_stack_ffffffffffffff28,
                              (__normal_iterator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>_>
                               *)in_stack_ffffffffffffff20), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>_>
                   *)in_stack_ffffffffffffff18);
      std::
      __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(in_stack_ffffffffffffff18);
      GetType(in_stack_ffffffffffffff20);
      std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::push_back
                ((vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
                 in_stack_ffffffffffffff18,(value_type *)0x1a3a092);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>_>
                    *)in_stack_ffffffffffffff18);
    }
  }
  sVar4 = std::
          vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ::size((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffff18);
  if (sVar4 != 0) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::operator[](in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
    std::
    __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_stack_ffffffffffffff18);
    GetType(in_stack_ffffffffffffff20);
  }
  sVar4 = std::
          vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ::size((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffff18);
  if (1 < sVar4) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::operator[](in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
    std::
    __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_stack_ffffffffffffff18);
    GetType(in_stack_ffffffffffffff20);
  }
  sVar4 = std::
          vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          ::size((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffff18);
  if (sVar4 < 3) {
    TVar3 = (Type)0;
  }
  else {
    std::
    vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
    ::operator[](in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
    std::
    __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_stack_ffffffffffffff18);
    TVar3 = GetType(in_stack_ffffffffffffff20);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff18);
  std::
  vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
  ::size((vector<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
          *)in_stack_ffffffffffffff18);
  this_00 = (vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffff18);
  miniscript::internal::ComputeType
            (in_stack_00000354,in_stack_0000077c,in_stack_00000778,in_stack_00000774,
             in_stack_00000348,in_stack_00000344,in_stack_00000790,in_stack_00000798,
             in_stack_000007a0,in_stack_000007a8);
  TVar3 = miniscript::internal::SanitizeType(TVar3);
  std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Type)TVar3.m_flags;
}

Assistant:

Type CalcType() const {
        using namespace internal;

        // THRESH has a variable number of subexpressions
        std::vector<Type> sub_types;
        if (fragment == Fragment::THRESH) {
            for (const auto& sub : subs) sub_types.push_back(sub->GetType());
        }
        // All other nodes than THRESH can be computed just from the types of the 0-3 subexpressions.
        static constexpr auto NONE_MST{""_mst};
        Type x = subs.size() > 0 ? subs[0]->GetType() : NONE_MST;
        Type y = subs.size() > 1 ? subs[1]->GetType() : NONE_MST;
        Type z = subs.size() > 2 ? subs[2]->GetType() : NONE_MST;

        return SanitizeType(ComputeType(fragment, x, y, z, sub_types, k, data.size(), subs.size(), keys.size(), m_script_ctx));
    }